

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-elastic-local-frame-dynamical-system.cpp
# Opt level: O3

void __thiscall
stateObservation::flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::iterateDynamicsEuler
          (IMUElasticLocalFrameDynamicalSystem *this,Vector3 *positionCom,Vector3 *velocityCom,
          Vector3 *accelerationCom,Vector3 *AngMomentum,Vector3 *dotAngMomentum,Matrix3 *inertia,
          Matrix3 *dotInertia,IndexedVectorArray *contactPos,IndexedVectorArray *contactOri,
          Vector3 *position,Vector3 *linVelocity,Vector *fc,Vector3 *oriVector,Vector3 *angularVel,
          Vector *tc,Vector3 *fm,Vector3 *tm,Vector3 *addiForces,Vector3 *addiMoments,double dt)

{
  double *pdVar1;
  Matrix3 *mat;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  SrcEvaluatorType srcEvaluator;
  long lVar13;
  invalid_argument *this_00;
  ActualDstType actualDst_2;
  ActualDstType actualDst_1;
  ActualDstType actualDst;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double local_c8;
  double dStack_b0;
  type tmp;
  
  dVar20 = (this->op_).orientationVector0.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  if ((dVar20 == (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                 .m_data.array[0]) &&
     (!NAN(dVar20) &&
      !NAN((oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
           m_data.array[0]))) {
    dVar20 = (this->op_).orientationVector0.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    pdVar1 = (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array + 1;
    if ((dVar20 == *pdVar1) && (!NAN(dVar20) && !NAN(*pdVar1))) {
      dVar20 = (this->op_).orientationVector0.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [2];
      pdVar1 = (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array + 2;
      if ((dVar20 == *pdVar1) && (!NAN(dVar20) && !NAN(*pdVar1))) {
        dVar20 = (this->op_).curRotation0.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [8];
        goto LAB_0015ed34;
      }
    }
  }
  dVar20 = (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
           m_data.array[1];
  (this->op_).orientationVector0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[0] =
       (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0];
  (this->op_).orientationVector0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[1] = dVar20;
  local_e8 = (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array[2];
  (this->op_).orientationVector0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[2] = local_e8;
  auVar16 = *(undefined1 (*) [16])
             (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array;
  dVar17 = local_e8 * local_e8 + auVar16._8_8_ * auVar16._8_8_ + auVar16._0_8_ * auVar16._0_8_;
  dVar20 = SQRT(dVar17);
  if (9.999999999999999e-33 < dVar17) {
    auVar9._8_8_ = dVar20;
    auVar9._0_8_ = dVar20;
    auVar16 = divpd(auVar16,auVar9);
  }
  else {
    auVar16 = ZEXT816(0);
  }
  dVar18 = auVar16._8_8_;
  if (9.999999999999999e-33 < dVar17) {
    local_e8 = local_e8 / dVar20;
  }
  else {
    local_e8 = 1.0;
  }
  dVar20 = (double)(-(ulong)(9.999999999999999e-33 < dVar17) & (ulong)dVar20);
  dVar17 = sin(dVar20);
  local_c8 = auVar16._0_8_;
  dVar14 = cos(dVar20);
  dVar19 = 1.0 - dVar14;
  dVar6 = dVar19 * local_c8;
  dVar20 = dVar19 * local_e8 * local_e8 + dVar14;
  (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[0] = dVar14 + dVar6 * local_c8;
  (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[1] = dVar17 * local_e8 + dVar6 * dVar18;
  (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[2] = local_e8 * dVar6 - dVar17 * dVar18;
  (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[3] = dVar6 * dVar18 - dVar17 * local_e8;
  dVar7 = dVar19 * dVar18 * local_e8;
  dVar21 = dVar17 * local_c8 + dVar7;
  auVar16._8_4_ = SUB84(dVar21,0);
  auVar16._0_8_ = dVar14 + dVar19 * dVar18 * dVar18;
  auVar16._12_4_ = (int)((ulong)dVar21 >> 0x20);
  *(undefined1 (*) [16])
   ((this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
    m_data.array + 4) = auVar16;
  (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[6] = dVar17 * dVar18 + local_e8 * dVar6;
  (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[7] = dVar7 - dVar17 * local_c8;
  (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[8] = dVar20;
LAB_0015ed34:
  mat = &(this->op_).rFlex;
  dVar17 = (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[1];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[0] = (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[0];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[1] = dVar17;
  dVar17 = (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[3];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[2] = (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[2];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[3] = dVar17;
  dVar17 = (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[5];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[4] = (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[4];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[5] = dVar17;
  uVar10 = *(undefined4 *)
            ((long)(this->op_).curRotation0.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array + 0x34);
  uVar11 = *(undefined4 *)
            ((this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array + 7);
  uVar12 = *(undefined4 *)
            ((long)(this->op_).curRotation0.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array + 0x3c);
  *(undefined4 *)
   ((this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array + 6) = *(undefined4 *)
                  ((this->op_).curRotation0.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array + 6);
  *(undefined4 *)
   ((long)(this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array + 0x34) = uVar10;
  *(undefined4 *)
   ((this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array + 7) = uVar11;
  *(undefined4 *)
   ((long)(this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array + 0x3c) = uVar12;
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[8] = dVar20;
  (*(this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase[10])
            (this,positionCom,velocityCom,accelerationCom,AngMomentum,dotAngMomentum,inertia,
             dotInertia,contactPos,contactOri,position,linVelocity,&(this->op_).linearAcceleration,
             oriVector,mat,angularVel,&(this->op_).angularAcceleration,fc,tc,fm,tm,addiForces,
             addiMoments);
  dVar18 = dt * 0.5 * dt;
  dVar20 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
           .array[1] +
           (this->op_).linearAcceleration.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] *
           dVar18 + (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                    m_storage.m_data.array[1] * dt;
  auVar4._8_4_ = SUB84(dVar20,0);
  auVar4._0_8_ = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array[0] +
                 (this->op_).linearAcceleration.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [0] * dVar18 +
                 (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                 m_storage.m_data.array[0] * dt;
  auVar4._12_4_ = (int)((ulong)dVar20 >> 0x20);
  *(undefined1 (*) [16])
   (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array =
       auVar4;
  (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2]
       = (this->op_).linearAcceleration.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
         .m_storage.m_data.array[2] * dVar18 +
         (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
         m_data.array[2] * dt +
         (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
         array[2];
  dVar20 = (this->op_).linearAcceleration.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  dVar17 = (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
           m_data.array[1];
  (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
  [0] = (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
        .array[0] +
        (this->op_).linearAcceleration.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[0] * dt;
  (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
  [1] = dVar17 + dVar20 * dt;
  (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
  [2] = (this->op_).linearAcceleration.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[2] * dt +
        (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
        .array[2];
  auVar15._0_8_ =
       (this->op_).angularAcceleration.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[0] * dVar18 +
       (angularVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0] * dt;
  auVar15._8_8_ =
       (this->op_).angularAcceleration.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[1] * dVar18 +
       (angularVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[1] * dt;
  local_d8 = dVar18 * (this->op_).angularAcceleration.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array[2] +
             (angularVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array[2] * dt;
  dVar17 = local_d8 * local_d8 + auVar15._8_8_ * auVar15._8_8_ + auVar15._0_8_ * auVar15._0_8_;
  dVar20 = SQRT(dVar17);
  if (9.999999999999999e-33 < dVar17) {
    auVar8._8_8_ = dVar20;
    auVar8._0_8_ = dVar20;
    auVar16 = divpd(auVar15,auVar8);
    local_d8 = local_d8 / dVar20;
  }
  else {
    auVar16 = ZEXT816(0);
    local_d8 = 1.0;
  }
  dVar20 = (double)(-(ulong)(9.999999999999999e-33 < dVar17) & (ulong)dVar20);
  dVar17 = sin(dVar20);
  auVar2._8_4_ = SUB84(dVar17,0);
  auVar2._0_8_ = dVar17;
  auVar2._12_4_ = (int)((ulong)dVar17 >> 0x20);
  dVar20 = cos(dVar20);
  dVar21 = 1.0 - dVar20;
  local_e8 = auVar16._0_8_;
  dStack_e0 = auVar16._8_8_;
  dVar14 = dVar21 * local_e8;
  dStack_b0 = auVar2._8_8_;
  dVar18 = local_d8 * dVar21 * dStack_e0;
  lVar13 = 0;
  do {
    dVar6 = *(double *)
             ((long)(this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array + lVar13 + 0x10);
    pdVar1 = (double *)
             ((long)(this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array + lVar13);
    dVar7 = *pdVar1;
    dVar19 = pdVar1[1];
    *(double *)
     ((long)tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
     + lVar13) = dVar19 * (dStack_e0 * dVar14 - local_d8 * dVar17) +
                 dVar7 * (dVar20 + dVar14 * local_e8) +
                 dVar6 * (local_d8 * dVar14 + dStack_e0 * dVar17);
    *(double *)
     ((long)tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
     + lVar13 + 8) =
         dVar19 * (dVar20 + dStack_e0 * dVar21 * dStack_e0) +
         dVar7 * (dStack_e0 * dVar14 + local_d8 * dVar17) + dVar6 * (dVar18 - local_e8 * dStack_b0);
    *(double *)
     ((long)tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
     + lVar13 + 0x10) =
         (dVar18 + local_e8 * dStack_b0) * dVar19 + dVar6 * (dVar21 * local_d8 * local_d8 + dVar20)
         + (local_d8 * dVar14 - dStack_e0 * dVar17) * dVar7;
    lVar13 = lVar13 + 0x18;
  } while (lVar13 != 0x48);
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[0] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [0];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[1] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [1];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[2] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [2];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[3] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [3];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[4] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [4];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[5] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [5];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[6] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [6];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[7] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [7];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[8] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [8];
  dVar20 = (angularVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
           m_data.array[1] +
           dt * (this->op_).angularAcceleration.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                [1];
  auVar3._8_4_ = SUB84(dVar20,0);
  auVar3._0_8_ = (angularVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                 m_storage.m_data.array[0] +
                 dt * (this->op_).angularAcceleration.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array[0];
  auVar3._12_4_ = (int)((ulong)dVar20 >> 0x20);
  *(undefined1 (*) [16])
   (angularVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
       = auVar3;
  (angularVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
  [2] = dt * (this->op_).angularAcceleration.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
        + (angularVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
          m_data.array[2];
  Eigen::AngleAxis<double>::operator=
            (&(this->op_).orientationAA,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)mat);
  dVar20 = (this->op_).orientationAA.m_angle;
  dVar17 = dVar20 * (this->op_).orientationAA.m_axis.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                    array[1];
  auVar5._8_4_ = SUB84(dVar17,0);
  auVar5._0_8_ = dVar20 * (this->op_).orientationAA.m_axis.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[0];
  auVar5._12_4_ = (int)((ulong)dVar17 >> 0x20);
  *(undefined1 (*) [16])
   (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
       = auVar5;
  (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
  [2] = dVar20 * (this->op_).orientationAA.m_axis.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [2];
  if (this->contactModel_ == 2) {
    (*(this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase[0x18])
              (this,contactPos,position,linVelocity,oriVector,mat,angularVel,fc,tc);
  }
  else {
    if (this->contactModel_ != 1) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_00,
                 "IMUElasticLocalFrameDynamicalSystem: the contact model is incorrectly set.");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    (*(this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase[0x17])
              (this,contactPos,contactOri,&(this->op_).contactVelArray,
               &(this->op_).contactAngVelArray,position,linVelocity,oriVector,mat,angularVel,fc,tc);
  }
  return;
}

Assistant:

void IMUElasticLocalFrameDynamicalSystem::iterateDynamicsEuler(const Vector3 & positionCom,
                                                               const Vector3 & velocityCom,
                                                               const Vector3 & accelerationCom,
                                                               const Vector3 & AngMomentum,
                                                               const Vector3 & dotAngMomentum,
                                                               const Matrix3 & inertia,
                                                               const Matrix3 & dotInertia,
                                                               const IndexedVectorArray & contactPos,
                                                               const IndexedVectorArray & contactOri,
                                                               Vector3 & position,
                                                               Vector3 & linVelocity,
                                                               Vector & fc,
                                                               Vector3 & oriVector,
                                                               Vector3 & angularVel,
                                                               Vector & tc,
                                                               const Vector3 & fm,
                                                               const Vector3 & tm,
                                                               const Vector3 & addiForces,
                                                               const Vector3 & addiMoments,
                                                               double dt)
{

  op_.rFlex = computeRotation_(oriVector, 0);
  // compute new acceleration with the current flex position and velocity and input

  //        computeForcesAndMoments (contactPos, contactOri, op_.contactVelArray, op_.contactAngVelArray,
  //                          position, linVelocity, oriVector, op_.rFlex,
  //                             angularVel, fc, tc);

  computeAccelerations(positionCom, velocityCom, accelerationCom, AngMomentum, dotAngMomentum, inertia, dotInertia,
                       contactPos, contactOri, position, linVelocity, op_.linearAcceleration, oriVector, op_.rFlex,
                       angularVel, op_.angularAcceleration, fc, tc, fm, tm, addiForces, addiMoments);

  /// integrate kinematics with the last acceleration
  kine::integrateKinematics(position, linVelocity, op_.linearAcceleration, op_.rFlex, angularVel,
                            op_.angularAcceleration, dt);

  /// Adding a kinematic coupling to improve estimation of the velocities
  //        Vector3 constrainedLinVel;
  //        constrainedLinVel.setZero();
  //
  //        for(int i=0; i<getContactsNumber();++i)
  //        {
  //          constrainedLinVel += Vector3(op_.rFlex*contactPos[i]).cross(angularVel);
  //        }
  //        constrainedLinVel=constrainedLinVel/getContactsNumber();
  //
  //        double alphaLin=0.1; ///kinematic coupling weight
  //        linVelocity=alphaLin*linVelocity + (1-alphaLin) * constrainedLinVel;
  //        ///
  //
  //        Vector3 constrainedAngVel=angularVel;
  //        if (getContactsNumber()==2)
  //        {
  //
  //            Vector3 interlegAxis = contactPos[1]-contactPos[0];
  //            constrainedAngVel -= (angularVel.dot(interlegAxis) * interlegAxis)/interlegAxis.squaredNorm();
  //        }
  //        else if (getContactsNumber()>2)
  //        {
  //            constrainedAngVel.setZero();
  //        }
  //        double alphaAng = 0.1;
  //        angularVel = alphaAng*angularVel + (1-alphaAng)*constrainedAngVel;

  op_.orientationAA = op_.rFlex;
  oriVector.noalias() = op_.orientationAA.angle() * op_.orientationAA.axis();

  computeForcesAndMoments(contactPos, contactOri, op_.contactVelArray, op_.contactAngVelArray, position, linVelocity,
                          oriVector, op_.rFlex, angularVel, fc, tc);
}